

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<wchar_t,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<wchar_t,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  format_specs *pfVar4;
  int iVar5;
  num_writer f;
  wchar_t wVar6;
  uint uVar7;
  int iVar8;
  _Alloc_hider _Var9;
  _Alloc_hider _Var10;
  int iVar11;
  int num_digits;
  int iVar12;
  string_view prefix;
  string groups;
  undefined4 uStack_5c;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  grouping_impl<wchar_t>(&local_58,(locale_ref)(this->writer->locale_).locale_);
  if (local_58._M_string_length == 0) {
    on_dec(this);
  }
  else {
    wVar6 = thousands_sep_impl<wchar_t>((locale_ref)(this->writer->locale_).locale_);
    if (wVar6 == L'\0') {
      on_dec(this);
    }
    else {
      uVar3 = this->abs_value;
      uVar7 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = (uVar7 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      iVar11 = uVar7 + (*(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar7 * 4) <=
                       uVar3);
      pcVar1 = local_58._M_dataplus._M_p + local_58._M_string_length;
      _Var10._M_p = local_58._M_dataplus._M_p;
      num_digits = iVar11;
      iVar8 = iVar11;
      if (local_58._M_string_length != 0) {
        iVar5 = (int)local_58._M_string_length;
        _Var9._M_p = local_58._M_dataplus._M_p;
        do {
          cVar2 = *_Var9._M_p;
          iVar12 = iVar8 - cVar2;
          _Var10._M_p = _Var9._M_p;
          num_digits = iVar11;
          if ((iVar12 == 0 || iVar8 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          iVar11 = iVar11 + 1;
          _Var9._M_p = _Var9._M_p + 1;
          local_58._M_string_length = local_58._M_string_length - 1;
          _Var10._M_p = pcVar1;
          num_digits = iVar5 + uVar7 + (*(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                                 (ulong)uVar7 * 4) <= uVar3);
          iVar8 = iVar12;
        } while (local_58._M_string_length != 0);
      }
      if (_Var10._M_p == pcVar1) {
        num_digits = num_digits + (iVar8 + -1) / (int)pcVar1[-1];
      }
      pfVar4 = this->specs;
      local_38._0_4_ = pfVar4->width;
      local_38._4_4_ = pfVar4->precision;
      uStack_30._0_1_ = pfVar4->type;
      uStack_30._1_3_ = *(undefined3 *)&pfVar4->field_0x9;
      uStack_30._4_4_ = (pfVar4->fill).data_[0];
      local_28 = *(undefined8 *)((pfVar4->fill).data_ + 1);
      uStack_20 = *(undefined8 *)((pfVar4->fill).data_ + 3);
      f._20_4_ = uStack_5c;
      f.sep = wVar6;
      f.size = num_digits;
      f.abs_value = uVar3;
      f.groups = &local_58;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<fmt::v6::buffer_range<wchar_t>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<wchar_t,fmt::v6::basic_format_specs<wchar_t>>::num_writer>
                ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,num_digits,prefix,
                 *pfVar4,f);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }